

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifdlw(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  long lVar2;
  long in_RDI;
  voccxdef *voc;
  prpnum prpn;
  objnum objn;
  uchar *wrd;
  int in_stack_00000054;
  int in_stack_00000058;
  prpnum in_stack_0000005e;
  char *in_stack_00000060;
  objnum in_stack_0000006e;
  voccxdef *in_stack_00000070;
  int in_stack_00000080;
  int in_stack_ffffffffffffffbc;
  runcxdef *in_stack_ffffffffffffffc0;
  
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\r') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  uVar1 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  if ((1 < uVar1) && (uVar1 < 8)) {
    vocdel1(in_stack_00000070,in_stack_0000006e,in_stack_00000060,in_stack_0000005e,
            in_stack_00000058,in_stack_00000054,in_stack_00000080);
    return;
  }
  *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "delword";
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
  runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
}

Assistant:

void bifdlw(bifcxdef *ctx, int argc)
{
    uchar    *wrd;
    objnum    objn;
    prpnum    prpn;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;

    bifcntargs(ctx, 3, argc);

    /* get the arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    wrd = runpopstr(ctx->bifcxrun);

    /* make sure the property is a valid part of speech property */
    if (!prpisvoc(prpn))
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "delword");

    /* delete the word */
    vocdel1(voc, objn, (char *)wrd, prpn, FALSE, FALSE, TRUE);
}